

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::tracker_logger::tracker_request_error
          (tracker_logger *this,tracker_request *param_1,error_code *ec,operation_t op,string *str,
          seconds32 retry_interval)

{
  char *pcVar1;
  long *local_40 [2];
  long local_30 [2];
  
  pcVar1 = operation_name(op);
  (*ec->cat_->_vptr_error_category[4])(local_40,ec->cat_,(ulong)(uint)ec->val_);
  (*(this->super_request_callback)._vptr_request_callback[7])
            (this,"*** tracker error: [%s] %s %s",pcVar1,local_40[0],(str->_M_dataplus)._M_p);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

void tracker_logger::tracker_request_error(tracker_request const&
			, error_code const& ec, operation_t const op, std::string const& str
			, seconds32 const retry_interval)
		{
			TORRENT_UNUSED(retry_interval);
			debug_log("*** tracker error: [%s] %s %s"
				, operation_name(op), ec.message().c_str(), str.c_str());
		}